

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2Impl::recompose
          (Normalizer2Impl *this,ReorderingBuffer *buffer,int32_t recomposeStartIndex,
          UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  uint16_t *puVar8;
  UChar *pUVar9;
  ushort uVar10;
  UChar *pUVar11;
  ulong uVar12;
  UChar *pUVar13;
  UChar *pUVar14;
  ushort *puVar15;
  UCPTrie *trie;
  UChar *pUVar16;
  ushort uVar17;
  uint16_t *list;
  uint c;
  uint c_00;
  
  pUVar14 = buffer->start + recomposeStartIndex;
  pUVar16 = buffer->limit;
  if (pUVar14 == pUVar16) {
    return;
  }
  puVar8 = (uint16_t *)0x0;
  uVar10 = 0;
  bVar4 = false;
  puVar15 = (ushort *)0x0;
  do {
    list = puVar8;
    pUVar9 = pUVar14;
LAB_00294f18:
    uVar17 = uVar10;
    pUVar14 = pUVar9 + 1;
    UVar1 = *pUVar9;
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((((ushort)UVar1 >> 10 & 1) == 0) && (pUVar14 != pUVar16)) {
        UVar1 = *pUVar14;
        trie = this->normTrie;
        if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
          pUVar14 = pUVar9 + 2;
          c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar6 = ucptrie_internalSmallIndex_63(trie,c);
            trie = this->normTrie;
          }
          else {
            iVar6 = trie->dataLength + -2;
          }
          goto LAB_00294fc3;
        }
      }
      else {
        trie = this->normTrie;
      }
      iVar6 = trie->dataLength + -1;
    }
    else {
      trie = this->normTrie;
      iVar6 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
LAB_00294fc3:
    uVar2 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar6 * 2);
    uVar10 = 0;
    if (0xfbff < uVar2) {
      uVar10 = uVar2 >> 1;
    }
    uVar3 = this->minMaybeYes;
    pUVar11 = pUVar16;
    pUVar9 = pUVar14;
    if ((((uVar2 < 0xfe01) && (uVar3 <= uVar2)) && (list != (uint16_t *)0x0)) &&
       ((byte)uVar17 == 0 || (byte)uVar17 < (byte)uVar10)) {
      if (uVar2 == 0xfe00) {
        if ((c < 0x11a7) && ((ushort)(*puVar15 + 0xef00) < 0x13)) {
          uVar10 = ((short)c + (*puVar15 + 0xef00) * 0x15) * 0x1c + 0xc564;
          if ((pUVar14 != pUVar16) && ((ushort)(*pUVar14 + L'\xee59') < 0x1c)) {
            uVar10 = *pUVar14 + L'\xee59' + uVar10;
            pUVar9 = pUVar14 + 1;
          }
          pUVar14 = pUVar14 + -1;
          *puVar15 = uVar10;
          pUVar11 = pUVar14;
          if (pUVar16 <= pUVar9) goto LAB_0029532d;
          do {
            UVar1 = *pUVar9;
            pUVar9 = pUVar9 + 1;
            *pUVar11 = UVar1;
            pUVar11 = pUVar11 + 1;
          } while (pUVar9 < pUVar16);
        }
        pUVar16 = pUVar11;
        list = (uint16_t *)0x0;
        pUVar9 = pUVar14;
        uVar10 = uVar17;
        if (pUVar14 == pUVar11) goto LAB_0029532d;
        goto LAB_00294f18;
      }
      uVar7 = combine(list,c);
      if (-1 < (int)uVar7) {
        c_00 = uVar7 >> 1;
        uVar12 = (ulong)(c < 0x10000) | 0xfffffffffffffffe;
        pUVar9 = pUVar14 + uVar12;
        uVar10 = (ushort)c_00;
        if (bVar4) {
          if (c_00 - 0x10000 < 0x100000) {
            *puVar15 = (short)(uVar7 >> 0xb) + 0xd7c0;
            puVar15[1] = uVar10 & 0x3ff | 0xdc00;
LAB_00295224:
            bVar4 = true;
          }
          else {
            *puVar15 = uVar10;
            if (puVar15 + 2 < pUVar9) {
              pUVar13 = pUVar14 + uVar12;
              if (pUVar14 + uVar12 <= puVar15 + 3) {
                pUVar13 = (UChar *)(puVar15 + 3);
              }
              memmove(puVar15 + 1,puVar15 + 2,
                      ((long)pUVar13 + (-5 - (long)puVar15) & 0xfffffffffffffffeU) + 2);
            }
            pUVar9 = pUVar9 + -1;
            bVar4 = false;
          }
        }
        else {
          pUVar13 = pUVar9;
          if (c_00 - 0x10000 < 0x100000) {
            for (; puVar15 + 1 < pUVar13; pUVar13 = pUVar13 + -1) {
              *pUVar13 = pUVar13[-1];
            }
            pUVar9 = pUVar9 + 1;
            puVar15[1] = uVar10 & 0x3ff | 0xdc00;
            *puVar15 = (short)(uVar7 >> 0xb) + 0xd7c0;
            goto LAB_00295224;
          }
          *puVar15 = uVar10;
          bVar4 = false;
        }
        if (pUVar9 < pUVar14) {
          pUVar11 = pUVar9;
          if (pUVar16 <= pUVar14) goto LAB_0029532d;
          do {
            UVar1 = *pUVar14;
            pUVar14 = pUVar14 + 1;
            *pUVar11 = UVar1;
            pUVar11 = pUVar11 + 1;
          } while (pUVar14 < pUVar16);
        }
        else {
          pUVar9 = pUVar14;
          if (pUVar14 == pUVar16) goto LAB_0029532d;
        }
        list = (uint16_t *)0x0;
        pUVar16 = pUVar11;
        uVar10 = uVar17 & 0xff;
        if ((uVar7 & 1) != 0) {
          uVar5 = getRawNorm16(this,c_00);
          list = (uint16_t *)
                 ((long)this->extraData +
                 (ulong)(*(ushort *)((long)this->extraData + (ulong)(uVar5 & 0xfffe)) & 0x1f) * 2 +
                 (ulong)(uVar5 & 0xfffe) + 2);
          uVar10 = uVar17 & 0xff;
        }
        goto LAB_00294f18;
      }
    }
    if (pUVar14 == pUVar16) {
LAB_0029532d:
      buffer->remainingCapacity =
           buffer->remainingCapacity + (int)((ulong)((long)buffer->limit - (long)pUVar11) >> 1);
      buffer->limit = pUVar11;
      buffer->reorderStart = pUVar11;
      buffer->lastCC = '\0';
      return;
    }
    if ((byte)uVar10 != 0) {
      if (onlyContiguous != '\0') {
        list = (uint16_t *)0x0;
      }
      goto LAB_00294f18;
    }
    list = (uint16_t *)0x0;
    if ((ushort)(uVar2 + 0x400) < 0x402) goto LAB_00294f18;
    puVar8 = (uint16_t *)
             ((long)this->maybeYesCompositions + ((ulong)uVar2 * 2 - (ulong)((uint)uVar3 * 2)));
    if (uVar2 < uVar3) {
      puVar8 = (uint16_t *)((ulong)((uint)(uVar2 >> 1) * 2) + (long)this->extraData);
    }
    list = (uint16_t *)0x0;
    if (puVar8 == (uint16_t *)0x0) goto LAB_00294f18;
    bVar4 = c >= 0x10000;
    puVar15 = (ushort *)(((ulong)((uint)(c < 0x10000) * 2) | 0xfffffffffffffffc) + (long)pUVar14);
  } while( true );
}

Assistant:

void Normalizer2Impl::recompose(ReorderingBuffer &buffer, int32_t recomposeStartIndex,
                                UBool onlyContiguous) const {
    UChar *p=buffer.getStart()+recomposeStartIndex;
    UChar *limit=buffer.getLimit();
    if(p==limit) {
        return;
    }

    UChar *starter, *pRemove, *q, *r;
    const uint16_t *compositionsList;
    UChar32 c, compositeAndFwd;
    uint16_t norm16;
    uint8_t cc, prevCC;
    UBool starterIsSupplementary;

    // Some of the following variables are not used until we have a forward-combining starter
    // and are only initialized now to avoid compiler warnings.
    compositionsList=NULL;  // used as indicator for whether we have a forward-combining starter
    starter=NULL;
    starterIsSupplementary=FALSE;
    prevCC=0;

    for(;;) {
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        cc=getCCFromYesOrMaybe(norm16);
        if( // this character combines backward and
            isMaybe(norm16) &&
            // we have seen a starter that combines forward and
            compositionsList!=NULL &&
            // the backward-combining character is not blocked
            (prevCC<cc || prevCC==0)
        ) {
            if(isJamoVT(norm16)) {
                // c is a Jamo V/T, see if we can compose it with the previous character.
                if(c<Hangul::JAMO_T_BASE) {
                    // c is a Jamo Vowel, compose with previous Jamo L and following Jamo T.
                    UChar prev=(UChar)(*starter-Hangul::JAMO_L_BASE);
                    if(prev<Hangul::JAMO_L_COUNT) {
                        pRemove=p-1;
                        UChar syllable=(UChar)
                            (Hangul::HANGUL_BASE+
                             (prev*Hangul::JAMO_V_COUNT+(c-Hangul::JAMO_V_BASE))*
                             Hangul::JAMO_T_COUNT);
                        UChar t;
                        if(p!=limit && (t=(UChar)(*p-Hangul::JAMO_T_BASE))<Hangul::JAMO_T_COUNT) {
                            ++p;
                            syllable+=t;  // The next character was a Jamo T.
                        }
                        *starter=syllable;
                        // remove the Jamo V/T
                        q=pRemove;
                        r=p;
                        while(r<limit) {
                            *q++=*r++;
                        }
                        limit=q;
                        p=pRemove;
                    }
                }
                /*
                 * No "else" for Jamo T:
                 * Since the input is in NFD, there are no Hangul LV syllables that
                 * a Jamo T could combine with.
                 * All Jamo Ts are combined above when handling Jamo Vs.
                 */
                if(p==limit) {
                    break;
                }
                compositionsList=NULL;
                continue;
            } else if((compositeAndFwd=combine(compositionsList, c))>=0) {
                // The starter and the combining mark (c) do combine.
                UChar32 composite=compositeAndFwd>>1;

                // Replace the starter with the composite, remove the combining mark.
                pRemove=p-U16_LENGTH(c);  // pRemove & p: start & limit of the combining mark
                if(starterIsSupplementary) {
                    if(U_IS_SUPPLEMENTARY(composite)) {
                        // both are supplementary
                        starter[0]=U16_LEAD(composite);
                        starter[1]=U16_TRAIL(composite);
                    } else {
                        *starter=(UChar)composite;
                        // The composite is shorter than the starter,
                        // move the intermediate characters forward one.
                        starterIsSupplementary=FALSE;
                        q=starter+1;
                        r=q+1;
                        while(r<pRemove) {
                            *q++=*r++;
                        }
                        --pRemove;
                    }
                } else if(U_IS_SUPPLEMENTARY(composite)) {
                    // The composite is longer than the starter,
                    // move the intermediate characters back one.
                    starterIsSupplementary=TRUE;
                    ++starter;  // temporarily increment for the loop boundary
                    q=pRemove;
                    r=++pRemove;
                    while(starter<q) {
                        *--r=*--q;
                    }
                    *starter=U16_TRAIL(composite);
                    *--starter=U16_LEAD(composite);  // undo the temporary increment
                } else {
                    // both are on the BMP
                    *starter=(UChar)composite;
                }

                /* remove the combining mark by moving the following text over it */
                if(pRemove<p) {
                    q=pRemove;
                    r=p;
                    while(r<limit) {
                        *q++=*r++;
                    }
                    limit=q;
                    p=pRemove;
                }
                // Keep prevCC because we removed the combining mark.

                if(p==limit) {
                    break;
                }
                // Is the composite a starter that combines forward?
                if(compositeAndFwd&1) {
                    compositionsList=
                        getCompositionsListForComposite(getRawNorm16(composite));
                } else {
                    compositionsList=NULL;
                }

                // We combined; continue with looking for compositions.
                continue;
            }
        }

        // no combination this time
        prevCC=cc;
        if(p==limit) {
            break;
        }

        // If c did not combine, then check if it is a starter.
        if(cc==0) {
            // Found a new starter.
            if((compositionsList=getCompositionsListForDecompYes(norm16))!=NULL) {
                // It may combine with something, prepare for it.
                if(U_IS_BMP(c)) {
                    starterIsSupplementary=FALSE;
                    starter=p-1;
                } else {
                    starterIsSupplementary=TRUE;
                    starter=p-2;
                }
            }
        } else if(onlyContiguous) {
            // FCC: no discontiguous compositions; any intervening character blocks.
            compositionsList=NULL;
        }
    }
    buffer.setReorderingLimit(limit);
}